

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hungarian_algorithm.cpp
# Opt level: O1

void __thiscall
hungarian_algorithm::HungarianSolverBase::HungarianSolverBase
          (HungarianSolverBase *this,size_t num_rows,size_t num_cols)

{
  allocator_type local_3a;
  bool local_39;
  allocator_type local_38;
  bool local_37;
  allocator_type local_36;
  bool local_35;
  allocator_type local_34;
  bool local_33;
  allocator_type local_32;
  bool local_31;
  
  this->num_rows_ = num_rows;
  this->num_cols_ = num_cols;
  local_31 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->covered_rows_,num_rows,&local_31,&local_32);
  local_33 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->covered_cols_,this->num_cols_,&local_33,&local_34);
  local_35 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->zero_matrix_,this->num_cols_ * this->num_rows_,&local_35,&local_36);
  local_37 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->star_matrix_,this->num_cols_ * this->num_rows_,&local_37,&local_38);
  local_39 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->prime_matrix_,this->num_cols_ * this->num_rows_,&local_39,&local_3a);
  return;
}

Assistant:

HungarianSolverBase::HungarianSolverBase(const std::size_t num_rows, const std::size_t num_cols)
  : num_rows_(static_cast<std::size_t>(num_rows)), num_cols_(static_cast<std::size_t>(num_cols)),
    covered_rows_(num_rows_, false), covered_cols_(num_cols_, false), zero_matrix_(num_rows_ * num_cols_, false),
    star_matrix_(num_rows_ * num_cols_, false), prime_matrix_(num_rows_ * num_cols_, false)
{
}